

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mode_t mVar5;
  uint uVar6;
  int *piVar7;
  la_int64_t lVar8;
  char *pcVar9;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar10;
  archive_string *paVar11;
  ulong uVar12;
  mtree_entry *pmVar13;
  mtree_entry *pmVar14;
  long lVar15;
  size_t sVar16;
  mtree_entry **ppmVar17;
  size_t len;
  char *pcVar18;
  mtree_entry *pmVar19;
  char cVar20;
  char *pcVar21;
  size_t sVar22;
  ulong uVar23;
  char *__n;
  long lVar24;
  byte *pbVar25;
  long lVar26;
  mtree_option **global_00;
  stat *__buf;
  archive_entry **ppaVar27;
  timespec *ptVar28;
  mtree *mtree;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_128;
  archive_string *local_120;
  archive_read *local_118;
  long local_110;
  uint local_104;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  mtree *local_f0;
  char *local_e8;
  mtree_entry **local_e0;
  int local_d8 [2];
  mtree_entry *local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_d0 = (mtree_entry *)&mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_128 = (archive_entry *)0x0;
    detect_form(local_118,local_d8);
    local_e0 = mtree->entry_hashtable;
    lVar24 = 1;
    local_f8 = (mtree_entry *)0x0;
LAB_0057a4e8:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) {
      uVar23 = 0;
      paVar11 = local_120;
    }
    else {
      lVar26 = 0;
      uVar12 = 0;
      local_110 = lVar24;
      do {
        uVar23 = 0xffffffffffffffe2;
        paVar11 = local_120;
        lVar24 = local_110;
        if ((long)local_c0.st_dev < 0) goto LAB_0057a67c;
        pvVar10 = memchr(__s,10,local_c0.st_dev);
        if (pvVar10 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar10 + (1 - (long)__s);
        }
        if (0xffff < (long)(local_c0.st_dev + uVar12)) {
          iVar3 = 0x54;
          pcVar9 = "Line too long";
LAB_0057a661:
          archive_set_error(&local_118->archive,iVar3,pcVar9);
          paVar11 = local_120;
          lVar24 = local_110;
          goto LAB_0057a67c;
        }
        paVar11 = archive_string_ensure(&mtree->line,local_c0.st_dev + uVar12 + 1);
        if (paVar11 == (archive_string *)0x0) {
          iVar3 = 0xc;
          pcVar9 = "Can\'t allocate working buffer";
          goto LAB_0057a661;
        }
        memcpy((mtree->line).s + uVar12,__s,local_c0.st_dev);
        __archive_read_consume(local_118,local_c0.st_dev);
        uVar23 = uVar12 + local_c0.st_dev;
        (mtree->line).s[uVar23] = '\0';
        paVar11 = (archive_string *)(mtree->line).s;
        pbVar25 = (byte *)((long)paVar11 + lVar26);
LAB_0057a5a8:
        bVar1 = *pbVar25;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar10 == (void *)0x0) goto LAB_0057a5ec;
          }
          else {
            if (bVar1 == 0) goto LAB_0057a5ec;
            lVar24 = local_110;
            if (bVar1 == 10) goto LAB_0057a67c;
          }
LAB_0057a5dd:
          pbVar25 = pbVar25 + 1;
          goto LAB_0057a5a8;
        }
        if ((bVar1 != 0x5c) || (pbVar25[1] == 0)) goto LAB_0057a5dd;
        if (pbVar25[1] != 10) {
          pbVar25 = pbVar25 + 1;
          goto LAB_0057a5dd;
        }
        *(char *)((long)paVar11 + (uVar23 - 2)) = '\0';
        uVar23 = uVar23 - 2;
LAB_0057a5ec:
        lVar26 = (long)pbVar25 - (long)(mtree->line).s;
        __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
        uVar12 = uVar23;
      } while (__s != (void *)0x0);
      uVar23 = 0;
      paVar11 = local_120;
      lVar24 = local_110;
    }
LAB_0057a67c:
    iVar3 = local_d8[0];
    if (uVar23 == 0) {
      mtree->this_entry = mtree->entries;
      free_options((mtree_option *)local_128);
      iVar3 = 0;
      goto LAB_0057ac49;
    }
    if (-1 < (long)uVar23) {
      lVar26 = 0;
      pcVar9 = (char *)paVar11;
      while( true ) {
        pcVar9 = pcVar9 + 1;
        uVar12 = (ulong)*(byte *)((long)paVar11 + lVar26);
        local_120 = paVar11;
        if (0x2f < uVar12) break;
        if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_0057abdf;
          if (uVar12 == 0x2f) {
            if (((long)(uVar23 - lVar26) < 5) ||
               (iVar3 = strncmp((char *)((long)paVar11 + lVar26),"/set",4), iVar3 != 0)) {
              if (((6 < (long)(uVar23 - lVar26)) &&
                  (iVar3 = strncmp((char *)((long)paVar11 + lVar26),"/unset",6), paVar11 = local_120
                  , iVar3 == 0)) &&
                 ((*(char *)((long)local_120 + lVar26 + 6) == ' ' ||
                  (*(char *)((long)local_120 + lVar26 + 6) == '\t')))) {
                pcVar21 = (char *)((long)local_120 + lVar26 + 6);
                pcVar9 = strchr(pcVar21,0x3d);
                if (pcVar9 == (char *)0x0) {
                  sVar16 = strspn(pcVar21," \t\r\n");
                  uVar23 = 0;
                  if (*(char *)((long)paVar11 + lVar26 + 6 + sVar16) != '\0') {
                    pcVar9 = (char *)((long)paVar11 + lVar26 + sVar16 + 6);
                    local_f0 = mtree;
                    do {
                      sVar16 = strcspn(pcVar9," \t\r\n");
                      if ((sVar16 == 3) && (iVar3 = strncmp(pcVar9,"all",3), iVar3 == 0)) {
                        free_options((mtree_option *)local_128);
                        local_128 = (archive_entry *)0x0;
                      }
                      else {
                        remove_option((mtree_option **)&local_128,pcVar9,sVar16);
                      }
                      pcVar21 = pcVar9 + sVar16;
                      sVar16 = strspn(pcVar21," \t\r\n");
                      pcVar9 = pcVar21 + sVar16;
                      paVar11 = local_120;
                      mtree = local_f0;
                    } while (pcVar21[sVar16] != '\0');
                  }
                }
                else {
                  archive_set_error(&local_118->archive,-1,"/unset shall not contain `=\'");
                  uVar23 = 0xffffffe2;
                }
                goto LAB_0057abdb;
              }
            }
            else if ((*(char *)((long)local_120 + lVar26 + 4) == ' ') ||
                    (*(char *)((long)local_120 + lVar26 + 4) == '\t')) {
              pcVar9 = (char *)((long)local_120 + lVar26 + 4);
              local_110 = lVar24;
              goto LAB_0057aa20;
            }
            archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",lVar24);
            free_options((mtree_option *)local_128);
            iVar3 = -0x1e;
            goto LAB_0057ac49;
          }
          break;
        }
        lVar26 = lVar26 + 1;
      }
      local_110 = lVar24;
      pmVar13 = (mtree_entry *)malloc(0x28);
      if (pmVar13 == (mtree_entry *)0x0) {
        piVar7 = __errno_location();
        archive_set_error(&local_118->archive,*piVar7,"Can\'t allocate memory");
        uVar23 = 0xffffffe2;
        paVar11 = local_120;
        lVar24 = local_110;
      }
      else {
        pcVar21 = (char *)((long)local_120 + lVar26);
        lVar24 = uVar23 - lVar26;
        pmVar13->name_hash = 0;
        pmVar13->hashtable_next = (mtree_entry *)0x0;
        pmVar13->next = (mtree_entry *)0x0;
        pmVar13->options = (mtree_option *)0x0;
        *(undefined8 *)((long)&pmVar13->options + 2) = 0;
        *(undefined8 *)((long)&pmVar13->name + 2) = 0;
        pmVar14 = local_f8;
        if (local_f8 == (mtree_entry *)0x0) {
          pmVar14 = local_d0;
        }
        pmVar14->next = pmVar13;
        local_100 = pmVar13;
        if (iVar3 == 0) {
          __n = (char *)strcspn(pcVar21," \t\r\n");
          pcVar9 = __n + (long)pcVar21;
          local_e8 = pcVar9 + lVar24;
          pcVar18 = pcVar21;
        }
        else {
          do {
            if (lVar24 < 1) break;
            bVar2 = false;
            if (((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar24) < 0x21) &&
               ((0x100002600U >> ((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar24) & 0x3f) &
                1) != 0)) {
              lVar24 = lVar24 + -1;
              bVar2 = true;
            }
          } while (bVar2);
          lVar15 = lVar24;
          local_e8 = pcVar21;
          if (0 < lVar24) {
            do {
              if (((ulong)(byte)pcVar9[-1] < 0x21) &&
                 ((0x100002600U >> ((ulong)(byte)pcVar9[-1] & 0x3f) & 1) != 0)) {
                local_e8 = pcVar9;
              }
              pcVar9 = pcVar9 + 1;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          __n = pcVar21 + (lVar24 - (long)local_e8);
          pcVar18 = local_e8;
          pcVar9 = pcVar21;
        }
        pcVar21 = (char *)malloc((size_t)(__n + 1));
        local_100->name = pcVar21;
        if (pcVar21 == (char *)0x0) {
          piVar7 = __errno_location();
          archive_set_error(&local_118->archive,*piVar7,"Can\'t allocate memory");
          uVar23 = 0xffffffe2;
        }
        else {
          memcpy(pcVar21,pcVar18,(size_t)__n);
          pmVar13 = local_100;
          pcVar21[(long)__n] = '\0';
          parse_escapes(pcVar21,local_100);
          pcVar21 = pmVar13->name;
          cVar20 = *pcVar21;
          if (cVar20 == '\0') {
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            do {
              pcVar21 = pcVar21 + 1;
              uVar6 = uVar6 * 0x10 + (int)cVar20;
              if ((uVar6 & 0xf0000000) != 0) {
                uVar6 = uVar6 & 0xfffffff ^ (uVar6 & 0xf0000000) >> 0x18;
              }
              cVar20 = *pcVar21;
            } while (cVar20 != '\0');
          }
          pmVar13->name_hash = uVar6;
          pmVar14 = local_e0[uVar6 & 0x3ff];
          if (local_e0[uVar6 & 0x3ff] == (mtree_entry *)0x0) {
            ppmVar17 = local_e0 + (uVar6 & 0x3ff);
          }
          else {
            do {
              pmVar19 = pmVar14;
              pmVar14 = pmVar19->hashtable_next;
            } while (pmVar14 != (mtree_entry *)0x0);
            ppmVar17 = &pmVar19->hashtable_next;
          }
          global_00 = &pmVar13->options;
          *ppmVar17 = pmVar13;
          ppaVar27 = &local_128;
          do {
            ppaVar27 = (archive_entry **)*ppaVar27;
            if (ppaVar27 == (archive_entry **)0x0) goto LAB_0057ab3f;
            pcVar21 = (char *)((long *)ppaVar27)[1];
            sVar16 = strlen(pcVar21);
            uVar6 = add_option(local_118,global_00,pcVar21,sVar16);
          } while (uVar6 == 0);
          uVar23 = (ulong)uVar6;
        }
        local_f8 = local_100;
        paVar11 = local_120;
        lVar24 = local_110;
      }
      goto LAB_0057abdb;
    }
LAB_0057ac00:
    iVar3 = (int)uVar23;
    free_options((mtree_option *)local_128);
LAB_0057ac49:
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  (local_118->archive).archive_format = mtree->archive_format;
  (local_118->archive).archive_format_name = mtree->archive_format_name;
  pmVar13 = mtree->this_entry;
  if (pmVar13 != (mtree_entry *)0x0) {
    paVar11 = &mtree->current_dir;
    local_120 = paVar11;
    do {
      iVar3 = strcmp(pmVar13->name,"..");
      if (iVar3 == 0) {
        pmVar13->used = '\x01';
        sVar22 = (mtree->current_dir).length;
        if (sVar22 != 0) {
          pcVar9 = (mtree->current_dir).s;
          pcVar21 = pcVar9 + sVar22;
          do {
            pcVar18 = pcVar21;
            pcVar21 = pcVar18 + -1;
            if (pcVar21 < pcVar9) break;
          } while (*pcVar21 != '/');
          pcVar18 = pcVar18 + -2;
          if (pcVar21 < pcVar9) {
            pcVar18 = pcVar21;
          }
          (mtree->current_dir).length = (size_t)(pcVar18 + (1 - (long)pcVar9));
        }
      }
      if (pmVar13->used == '\0') {
        local_128 = local_c8;
        pmVar13->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_128,0);
        (mtree->contents_name).length = 0;
        local_104 = 0;
        iVar3 = parse_line(local_118,local_128,mtree,pmVar13,(int *)&local_104);
        if (pmVar13->full == '\0') {
          sVar22 = (mtree->current_dir).length;
          if (sVar22 != 0) {
            archive_strcat(paVar11,"/");
          }
          archive_strcat(paVar11,pmVar13->name);
          archive_entry_copy_pathname(local_128,paVar11->s);
          mVar5 = archive_entry_filetype(local_128);
          if (mVar5 != 0x4000) {
            (mtree->current_dir).length = sVar22;
          }
        }
        else {
          archive_entry_copy_pathname(local_128,pmVar13->name);
          for (pmVar14 = pmVar13->hashtable_next; pmVar14 != (mtree_entry *)0x0;
              pmVar14 = pmVar14->hashtable_next) {
            if ((((pmVar14->full != '\0') && (pmVar14->used == '\0')) &&
                (pmVar13->name_hash == pmVar14->name_hash)) &&
               (iVar4 = strcmp(pmVar13->name,pmVar14->name), iVar4 == 0)) {
              pmVar14->used = '\x01';
              iVar4 = parse_line(local_118,local_128,mtree,pmVar14,(int *)&local_104);
              if (iVar4 < iVar3) {
                iVar3 = iVar4;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0057a3a7:
          paVar11 = local_120;
          lVar8 = archive_entry_size(local_128);
          mtree->cur_size = lVar8;
          mtree->offset = 0;
          bVar2 = true;
          iVar4 = iVar3;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar9 = archive_entry_pathname(local_128);
          }
          else {
            pcVar9 = (mtree->contents_name).s;
          }
          __buf = &local_c0;
          mVar5 = archive_entry_filetype(local_128);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x4000)) {
            iVar4 = open(pcVar9,0x80000);
            mtree->fd = iVar4;
            __archive_ensure_cloexec_flag(iVar4);
            if (mtree->fd == -1) {
              piVar7 = __errno_location();
              if ((*piVar7 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar7,"Can\'t open %s",pcVar9);
                iVar3 = -0x14;
              }
            }
          }
          if (mtree->fd < 0) {
            iVar4 = lstat(pcVar9,__buf);
            if (iVar4 == -1) goto LAB_0057a189;
            ptVar28 = &local_c0.st_mtim;
          }
          else {
            iVar4 = fstat(mtree->fd,__buf);
            ptVar28 = &local_c0.st_mtim;
            if (iVar4 == -1) {
              piVar7 = __errno_location();
              archive_set_error(&local_118->archive,*piVar7,"Could not fstat %s",pcVar9);
              close(mtree->fd);
              mtree->fd = -1;
              iVar3 = -0x14;
LAB_0057a189:
              ptVar28 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar2 = false;
            iVar4 = 0;
            paVar11 = local_120;
            if ((local_104 & 0x800) == 0) goto LAB_0057a3a7;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar5 = archive_entry_filetype(local_128), mVar5 == 0xa000)))) ||
                 ((((~__buf->st_mode & 0xc000) == 0 &&
                   (mVar5 = archive_entry_filetype(local_128), mVar5 == 0xc000)) ||
                  (((__buf->st_mode & 0xf000) == 0x2000 &&
                   (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x2000)))))) ||
                ((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x4000)))))) ||
               (((__buf->st_mode & 0xf000) == 0x1000 &&
                (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x1000)))) {
              uVar6 = local_104;
              if (((local_104 & 0x1001) != 1) &&
                 ((mVar5 = archive_entry_filetype(local_128), mVar5 == 0x2000 ||
                  (mVar5 = archive_entry_filetype(local_128), mVar5 == 0x6000)))) {
                archive_entry_set_rdev(local_128,__buf->st_rdev);
              }
              if ((uVar6 & 0xc) == 0 || (uVar6 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_128,(ulong)__buf->st_gid);
              }
              if ((uVar6 & 0x600) == 0 || (uVar6 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_128,(ulong)__buf->st_uid);
              }
              if ((uVar6 & 0x1010) != 0x10) {
                archive_entry_set_mtime(local_128,(__buf->st_mtim).tv_sec,ptVar28->tv_nsec);
              }
              if ((uVar6 & 0x1020) != 0x20) {
                archive_entry_set_nlink(local_128,(uint)__buf->st_nlink);
              }
              if ((uVar6 & 0x1040) != 0x40) {
                archive_entry_set_perm(local_128,__buf->st_mode);
              }
              if ((uVar6 & 0x1080) != 0x80) {
                archive_entry_set_size(local_128,__buf->st_size);
              }
              archive_entry_set_ino(local_128,__buf->st_ino);
              archive_entry_set_dev(local_128,__buf->st_dev);
              archive_entry_linkify(mtree->resolver,&local_128,(archive_entry **)local_d8);
              goto LAB_0057a3a7;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            paVar11 = local_120;
            mtree->fd = -1;
            iVar4 = iVar3;
            if ((local_104 & 0x800) == 0) {
              bVar2 = true;
              if (iVar3 == 0) {
                pcVar9 = archive_entry_pathname(local_128);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar9);
                iVar4 = -0x14;
                bVar2 = true;
              }
            }
            else {
              bVar2 = false;
            }
          }
        }
        if (bVar2) {
          return iVar4;
        }
      }
      pmVar13 = mtree->this_entry->next;
      mtree->this_entry = pmVar13;
    } while (pmVar13 != (mtree_entry *)0x0);
  }
  return 1;
  while( true ) {
    pcVar9 = pcVar9 + sVar16;
    sVar16 = strcspn(pcVar9," \t\r\n");
    local_e8 = pcVar9 + sVar16;
    pcVar21 = strchr(pcVar9,0x3d);
    sVar22 = (long)pcVar21 - (long)pcVar9;
    if (pcVar9 + sVar16 < pcVar21) {
      sVar22 = sVar16;
    }
    remove_option((mtree_option **)&local_128,pcVar9,sVar22);
    uVar6 = add_option(local_118,(mtree_option **)&local_128,pcVar9,sVar16);
    pcVar9 = local_e8;
    if (uVar6 != 0) break;
LAB_0057aa20:
    sVar16 = strspn(pcVar9," \t\r\n");
    if (pcVar9[sVar16] == '\0') {
      uVar23 = 0;
      paVar11 = local_120;
      lVar24 = local_110;
      goto LAB_0057abdb;
    }
  }
  uVar23 = (ulong)uVar6;
  paVar11 = local_120;
  lVar24 = local_110;
  goto LAB_0057abdb;
  while( true ) {
    len = strcspn(pcVar21," \t\r\n");
    pcVar9 = pcVar21 + len;
    pcVar18 = strchr(pcVar21,0x3d);
    sVar16 = (long)pcVar18 - (long)pcVar21;
    if (pcVar9 < pcVar18) {
      sVar16 = len;
    }
    if (pcVar18 == (char *)0x0) {
      sVar16 = len;
    }
    remove_option(global_00,pcVar21,sVar16);
    uVar6 = add_option(local_118,global_00,pcVar21,len);
    mtree = local_f0;
    if (uVar6 != 0) break;
LAB_0057ab3f:
    local_f0 = mtree;
    sVar16 = strspn(pcVar9," \t\r\n");
    uVar23 = 0;
    if ((pcVar9[sVar16] == '\0') || (pcVar21 = pcVar9 + sVar16, local_e8 <= pcVar21))
    goto LAB_0057abb8;
  }
  uVar23 = (ulong)uVar6;
LAB_0057abb8:
  local_f8 = local_100;
  paVar11 = local_120;
  lVar24 = local_110;
  mtree = local_f0;
LAB_0057abdb:
  if ((int)uVar23 != 0) goto LAB_0057ac00;
LAB_0057abdf:
  lVar24 = lVar24 + 1;
  local_120 = (archive_string *)((long)paVar11 + lVar26);
  goto LAB_0057a4e8;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}